

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O3

void __thiscall
itis::AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
insert(AVLTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value)

{
  pointer pcVar1;
  int iVar2;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **indirect;
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  path;
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_80;
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  local_78;
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_80 = &this->root;
  local_78.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ***)0x0;
  local_78.
  super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ***)0x0;
  if (this->root !=
      (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    do {
      if (local_78.
          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_78.
          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
        ::_M_realloc_insert<itis::AVLTreeNode<std::__cxx11::string>**const&>
                  ((vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
                    *)&local_78,
                   (iterator)
                   local_78.
                   super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_80);
      }
      else {
        *local_78.
         super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
         ._M_impl.super__Vector_impl_data._M_finish = local_80;
        local_78.
        super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_78.
             super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      iVar2 = std::__cxx11::string::compare((string *)&(*local_80)->value);
      local_80 = &(*local_80)->right + (0 < iVar2);
    } while (*local_80 !=
             (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)0x0);
  }
  this_00 = (AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x38);
  pcVar1 = (value->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + value->_M_string_length);
  AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  AVLTreeNode(this_00,&local_40);
  *local_80 = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if (local_78.
      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_78.
      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
    ::_M_realloc_insert<itis::AVLTreeNode<std::__cxx11::string>**const&>
              ((vector<itis::AVLTreeNode<std::__cxx11::string>**,std::allocator<itis::AVLTreeNode<std::__cxx11::string>**>>
                *)&local_78,
               (iterator)
               local_78.
               super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_80);
  }
  else {
    *local_78.
     super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
     ._M_impl.super__Vector_impl_data._M_finish = local_80;
    local_78.
    super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.
         super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  std::
  vector<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
  ::vector(&local_58,&local_78);
  balance(this,&local_58);
  if (local_58.
      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_58.
                          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.
                          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  this->_size = this->_size + 1;
  if (local_78.
      super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.
                    super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_78.
                          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.
                          super__Vector_base<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**,_std::allocator<itis::AVLTreeNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_**>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void AVLTree<T>::insert(T value) {
    AVLTreeNode<T> **indirect = &root;    // to generalize insertion
    std::vector<AVLTreeNode<T> **> path;  // to update height values

    while (*indirect != nullptr) {
      path.push_back(indirect);

      if ((*indirect)->value > value) {
        indirect = &((*indirect)->left);
      } else {
        indirect = &((*indirect)->right);
      }
    }

    *indirect = new AVLTreeNode<T>(value);
    path.push_back(indirect);

    balance(path);
    _size++;
  }